

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFExc.cc
# Opt level: O0

void __thiscall
QPDFExc::QPDFExc(QPDFExc *this,qpdf_error_code_e error_code,string *filename,string *object,
                qpdf_offset_t offset,string *message,bool zero_offset_valid)

{
  string *local_b8;
  qpdf_offset_t local_90;
  string local_60;
  byte local_39;
  string *psStack_38;
  bool zero_offset_valid_local;
  string *message_local;
  qpdf_offset_t offset_local;
  string *object_local;
  string *filename_local;
  QPDFExc *pQStack_10;
  qpdf_error_code_e error_code_local;
  QPDFExc *this_local;
  
  local_39 = zero_offset_valid;
  local_90 = offset;
  if ((offset == 0) && (!zero_offset_valid)) {
    local_90 = -1;
  }
  psStack_38 = message;
  message_local = (string *)offset;
  offset_local = (qpdf_offset_t)object;
  object_local = filename;
  filename_local._4_4_ = error_code;
  pQStack_10 = this;
  createWhat(&local_60,filename,object,local_90,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)this = &PTR__QPDFExc_0058abd8;
  this->error_code = filename_local._4_4_;
  std::__cxx11::string::string((string *)&this->filename,(string *)object_local);
  std::__cxx11::string::string((string *)&this->object,(string *)offset_local);
  if ((message_local == (string *)0x0) && ((local_39 & 1) == 0)) {
    local_b8 = (string *)0xffffffffffffffff;
  }
  else {
    local_b8 = message_local;
  }
  this->offset = (qpdf_offset_t)local_b8;
  std::__cxx11::string::string((string *)&this->message,(string *)psStack_38);
  return;
}

Assistant:

QPDFExc::QPDFExc(
    qpdf_error_code_e error_code,
    std::string const& filename,
    std::string const& object,
    qpdf_offset_t offset,
    std::string const& message,
    bool zero_offset_valid) :
    std::runtime_error(
        createWhat(filename, object, (offset || zero_offset_valid ? offset : -1), message)),
    error_code(error_code),
    filename(filename),
    object(object),
    offset(offset || zero_offset_valid ? offset : -1),
    message(message)
{
}